

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManSetLevels(Gia_Man_t *p,Vec_Int_t *vCiLevels)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCiLevels_local;
  Gia_Man_t *p_local;
  
  if (vCiLevels == (Vec_Int_t *)0x0) {
    p_local._4_4_ = Gia_ManLevelNum(p);
  }
  else {
    iVar1 = Vec_IntSize(vCiLevels);
    iVar2 = Gia_ManCiNum(p);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_IntSize(vCiLevels) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                    ,0x234,"int Gia_ManSetLevels(Gia_Man_t *, Vec_Int_t *)");
    }
    iVar1 = Gia_ManObjNum(p);
    Gia_ManCleanLevels(p,iVar1);
    p->nLevels = 0;
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar3 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCi(p,local_2c);
        bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Vec_IntEntry(vCiLevels,local_2c);
      Gia_ObjSetLevel(p,pGStack_28,iVar1);
      iVar1 = p->nLevels;
      iVar2 = Gia_ObjLevel(p,pGStack_28);
      iVar1 = Abc_MaxInt(iVar1,iVar2);
      p->nLevels = iVar1;
      local_2c = local_2c + 1;
    }
    local_2c = 0;
    while( true ) {
      bVar3 = false;
      if (local_2c < p->nObjs) {
        pGStack_28 = Gia_ManObj(p,local_2c);
        bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjIsAnd(pGStack_28);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_28);
        if (iVar1 != 0) {
          Gia_ObjSetCoLevel(p,pGStack_28);
          goto LAB_0025388e;
        }
      }
      else {
        Gia_ObjSetGateLevel(p,pGStack_28);
LAB_0025388e:
        iVar1 = p->nLevels;
        iVar2 = Gia_ObjLevel(p,pGStack_28);
        iVar1 = Abc_MaxInt(iVar1,iVar2);
        p->nLevels = iVar1;
      }
      local_2c = local_2c + 1;
    }
    p_local._4_4_ = p->nLevels;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManSetLevels( Gia_Man_t * p, Vec_Int_t * vCiLevels )  
{
    Gia_Obj_t * pObj;
    int i;
    if ( vCiLevels == NULL )
        return Gia_ManLevelNum( p );
    assert( Vec_IntSize(vCiLevels) == Gia_ManCiNum(p) );
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ObjSetLevel( p, pObj, Vec_IntEntry(vCiLevels, i) );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ObjSetGateLevel( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjSetCoLevel( p, pObj );
        else continue;
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}